

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O2

_Bool xdr_putuint16(XDR *xdrs,uint32_t uint16v)

{
  uint *puVar1;
  _Bool _Var2;
  
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,uint16v);
    return _Var2;
  }
  *(uint32_t *)xdrs->x_data =
       uint16v >> 0x18 | (uint16v & 0xff0000) >> 8 | (uint16v & 0xff00) << 8 | uint16v << 0x18;
  xdrs->x_data = (uint8_t *)puVar1;
  return true;
}

Assistant:

static inline bool
xdr_putuint16(XDR *xdrs, uint32_t uint16v)
{
	uint8_t *future = xdrs->x_data + sizeof(uint32_t);

	if (future <= xdrs->x_v.vio_wrap) {
		*((int32_t *) (xdrs->x_data)) = htonl(uint16v);
		xdrs->x_data = future;
		return (true);
	}
	return (*xdrs->x_ops->x_putunit)(xdrs, (uint32_t)uint16v);
}